

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O1

void outrumor(int truth,int mechanism)

{
  boolean bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char buf [256];
  char local_128 [264];
  
  if (0xfffffffd < mechanism - 3U) {
    bVar1 = is_fainted();
    if (mechanism == 1 && bVar1 != '\0') {
      return;
    }
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
      if (mechanism == 1) {
        pline("This cookie has a scrap of paper inside.");
      }
      pline("What a pity that you cannot read it!");
      return;
    }
  }
  getrumor(truth,local_128,mechanism - 3U < 0xfffffffe);
  pcVar3 = "Rumors file closed for renovation.";
  if (local_128[0] != '\0') {
    pcVar3 = local_128;
  }
  if (mechanism != 2) {
    if (mechanism != 1) {
      if (mechanism == 0) {
        uVar2 = mt_random();
        if ((uVar2 & 3) == 0) {
          pcVar4 = "offhandedly ";
        }
        else {
          uVar2 = mt_random();
          if (uVar2 * -0x55555555 < 0x55555556) {
            pcVar4 = "casually ";
          }
          else {
            uVar2 = mt_random();
            pcVar4 = "nonchalantly ";
            if ((uVar2 & 1) == 0) {
              pcVar4 = "";
            }
          }
        }
        pline("True to her word, the Oracle %ssays: ",pcVar4);
        verbalize("%s",pcVar3);
        exercise(2,'\x01');
        return;
      }
      goto LAB_00236444;
    }
    pline("This cookie has a scrap of paper inside.");
  }
  pline("It reads:");
LAB_00236444:
  pline("%s",pcVar3);
  return;
}

Assistant:

void outrumor(int truth, /* 1=true, -1=false, 0=either */
	      int mechanism)
{
	static const char fortune_msg[] =
		"This cookie has a scrap of paper inside.";
	const char *line;
	char buf[BUFSZ];
	boolean reading = (mechanism == BY_COOKIE ||
			   mechanism == BY_PAPER);

	if (reading) {
	    /* deal with various things that prevent reading */
	    if (is_fainted() && mechanism == BY_COOKIE)
	    	return;
	    else if (Blind) {
		if (mechanism == BY_COOKIE)
			pline(fortune_msg);
		pline("What a pity that you cannot read it!");
	    	return;
	    }
	}
	line = getrumor(truth, buf, reading ? FALSE : TRUE);
	if (!*line)
		line = "Rumors file closed for renovation.";
	switch (mechanism) {
	    case BY_ORACLE:
	 	/* Oracle delivers the rumor */
		pline("True to her word, the Oracle %ssays: ",
		  (!rn2(4) ? "offhandedly " : (!rn2(3) ? "casually " :
		  (rn2(2) ? "nonchalantly " : ""))));
		verbalize("%s", line);
		exercise(A_WIS, TRUE);
		return;
	    case BY_COOKIE:
		pline(fortune_msg);
		/* FALLTHRU */
	    case BY_PAPER:
		pline("It reads:");
		break;
	}
	pline("%s", line);
}